

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall
QCss::ValueExtractor::extractPosition
          (ValueExtractor *this,int *left,int *top,int *right,int *bottom,Origin *origin,
          Alignment *position,PositionMode *mode,Alignment *textAlignment)

{
  long lVar1;
  int iVar2;
  Origin OVar3;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> QVar4;
  PositionMode PVar5;
  ValueExtractor *this_00;
  qsizetype qVar6;
  DeclarationData *pDVar7;
  int *in_RCX;
  Declaration *this_01;
  int *in_RDX;
  int *in_RSI;
  QList<QCss::Declaration> *in_RDI;
  int *in_R8;
  Origin *in_R9;
  long in_FS_OFFSET;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> *in_stack_00000008;
  PositionMode *in_stack_00000010;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> *in_stack_00000018;
  Declaration *decl;
  int i;
  bool hit;
  qsizetype in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  int local_48;
  bool local_41;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  extractFont((ValueExtractor *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  local_41 = false;
  local_48 = 0;
  do {
    this_00 = (ValueExtractor *)(long)local_48;
    qVar6 = QList<QCss::Declaration>::size(in_RDI);
    if (qVar6 <= (long)this_00) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_41;
      }
      __stack_chk_fail();
    }
    QList<QCss::Declaration>::at
              ((QList<QCss::Declaration> *)
               CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    pDVar7 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2e1ea
                       );
    this_01 = (Declaration *)(ulong)(pDVar7->propertyId - Left);
    switch(this_01) {
    case (Declaration *)0x0:
      iVar2 = lengthValue(this_00,this_01);
      *in_RSI = iVar2;
      break;
    case (Declaration *)0x1:
      iVar2 = lengthValue(this_00,this_01);
      *in_RCX = iVar2;
      break;
    case (Declaration *)0x2:
      iVar2 = lengthValue(this_00,this_01);
      *in_RDX = iVar2;
      break;
    case (Declaration *)0x3:
      iVar2 = lengthValue(this_00,this_01);
      *in_R8 = iVar2;
      break;
    case (Declaration *)0x4:
      OVar3 = Declaration::originValue(this_01);
      *in_R9 = OVar3;
      break;
    case (Declaration *)0x5:
      QVar4.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)Declaration::alignmentValue((Declaration *)this_00);
      in_stack_00000008->super_QFlagsStorage<Qt::AlignmentFlag> =
           QVar4.super_QFlagsStorage<Qt::AlignmentFlag>.i;
      break;
    case (Declaration *)0x6:
      PVar5 = Declaration::positionValue(this_01);
      *in_stack_00000010 = PVar5;
      break;
    default:
      goto LAB_00a2e2f7;
    case (Declaration *)0xc:
      QVar4.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)Declaration::alignmentValue((Declaration *)this_00);
      in_stack_00000018->super_QFlagsStorage<Qt::AlignmentFlag> =
           QVar4.super_QFlagsStorage<Qt::AlignmentFlag>.i;
    }
    local_41 = true;
LAB_00a2e2f7:
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

bool ValueExtractor::extractPosition(int *left, int *top, int *right, int *bottom, QCss::Origin *origin,
                                     Qt::Alignment *position, QCss::PositionMode *mode, Qt::Alignment *textAlignment)
{
    extractFont();
    bool hit = false;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case Left: *left = lengthValue(decl); break;
        case Top: *top = lengthValue(decl); break;
        case Right: *right = lengthValue(decl); break;
        case Bottom: *bottom = lengthValue(decl); break;
        case QtOrigin: *origin = decl.originValue(); break;
        case QtPosition: *position = decl.alignmentValue(); break;
        case TextAlignment: *textAlignment = decl.alignmentValue(); break;
        case Position: *mode = decl.positionValue(); break;
        default: continue;
        }
        hit = true;
    }

    return hit;
}